

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O0

void dwt(wt_object wt,double *inp)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double *inp_00;
  double *cA;
  double dVar4;
  double *orig2;
  double *orig;
  int len_cA;
  int lp;
  int N;
  int iter;
  int temp_len;
  int J;
  int i;
  double *inp_local;
  wt_object wt_local;
  
  N = wt->siglength;
  iVar1 = wt->J;
  wt->length[iVar1 + 1] = N;
  wt->outlength = 0;
  wt->zpad = 0;
  inp_00 = (double *)malloc((long)N << 3);
  cA = (double *)malloc((long)N << 3);
  for (temp_len = 0; temp_len < wt->siglength; temp_len = temp_len + 1) {
    inp_00[temp_len] = inp[temp_len];
  }
  if (wt->zpad == 1) {
    inp_00[N + -1] = inp_00[N + -2];
  }
  iVar2 = wt->wave->lpd_len;
  iVar3 = strcmp(wt->ext,"per");
  len_cA = N;
  temp_len = iVar1;
  if (iVar3 == 0) {
    for (; 0 < temp_len; temp_len = temp_len + -1) {
      dVar4 = ceil((double)len_cA / 2.0);
      wt->length[temp_len] = (int)dVar4;
      wt->outlength = wt->length[temp_len] + wt->outlength;
      len_cA = (int)dVar4;
    }
    wt->length[0] = wt->length[1];
    wt->outlength = wt->length[0] + wt->outlength;
    len_cA = wt->outlength;
    for (lp = 0; lp < iVar1; lp = lp + 1) {
      iVar2 = wt->length[iVar1 - lp];
      len_cA = len_cA - iVar2;
      iVar3 = strcmp(wt->cmethod,"fft");
      if ((iVar3 == 0) || (iVar3 = strcmp(wt->cmethod,"FFT"), iVar3 == 0)) {
        dwt1(wt,inp_00,N,cA,(double *)(wt[1].method + (long)len_cA * 8 + -0x10));
      }
      else {
        dwt_per(wt,inp_00,N,cA,iVar2,(double *)(wt[1].method + (long)len_cA * 8 + -0x10));
      }
      N = wt->length[iVar1 - lp];
      if (lp == iVar1 + -1) {
        for (temp_len = 0; temp_len < iVar2; temp_len = temp_len + 1) {
          *(double *)(wt[1].method + (long)temp_len * 8 + -0x10) = cA[temp_len];
        }
      }
      else {
        for (temp_len = 0; temp_len < iVar2; temp_len = temp_len + 1) {
          inp_00[temp_len] = cA[temp_len];
        }
      }
    }
  }
  else {
    iVar3 = strcmp(wt->ext,"sym");
    if (iVar3 != 0) {
      printf("Signal extension can be either per or sym");
      exit(-1);
    }
    for (; 0 < temp_len; temp_len = temp_len + -1) {
      dVar4 = ceil((double)(len_cA + iVar2 + -2) / 2.0);
      wt->length[temp_len] = (int)dVar4;
      wt->outlength = wt->length[temp_len] + wt->outlength;
      len_cA = (int)dVar4;
    }
    wt->length[0] = wt->length[1];
    wt->outlength = wt->length[0] + wt->outlength;
    len_cA = wt->outlength;
    for (lp = 0; lp < iVar1; lp = lp + 1) {
      iVar2 = wt->length[iVar1 - lp];
      len_cA = len_cA - iVar2;
      iVar3 = strcmp(wt->cmethod,"fft");
      if ((iVar3 == 0) || (iVar3 = strcmp(wt->cmethod,"FFT"), iVar3 == 0)) {
        dwt1(wt,inp_00,N,cA,(double *)(wt[1].method + (long)len_cA * 8 + -0x10));
      }
      else {
        dwt_sym(wt,inp_00,N,cA,iVar2,(double *)(wt[1].method + (long)len_cA * 8 + -0x10));
      }
      N = wt->length[iVar1 - lp];
      if (lp == iVar1 + -1) {
        for (temp_len = 0; temp_len < iVar2; temp_len = temp_len + 1) {
          *(double *)(wt[1].method + (long)temp_len * 8 + -0x10) = cA[temp_len];
        }
      }
      else {
        for (temp_len = 0; temp_len < iVar2; temp_len = temp_len + 1) {
          inp_00[temp_len] = cA[temp_len];
        }
      }
    }
  }
  free(inp_00);
  free(cA);
  return;
}

Assistant:

void dwt(wt_object wt,const double *inp) {
	int i,J,temp_len,iter,N,lp;
	int len_cA;
	double *orig,*orig2;

	temp_len = wt->siglength;
	J = wt->J;
	wt->length[J + 1] = temp_len;
	wt->outlength = 0;
	wt->zpad = 0;
	orig = (double*)malloc(sizeof(double)* temp_len);
	orig2 = (double*)malloc(sizeof(double)* temp_len);
	/*
	if ((temp_len % 2) == 0) {
	wt->zpad = 0;
	orig = (double*)malloc(sizeof(double)* temp_len);
	orig2 = (double*)malloc(sizeof(double)* temp_len);
	}
	else {
	wt->zpad = 1;
	temp_len++;
	orig = (double*)malloc(sizeof(double)* temp_len);
	orig2 = (double*)malloc(sizeof(double)* temp_len);
	}
	*/

	for (i = 0; i < wt->siglength; ++i) {
		orig[i] = inp[i];
	}

	if (wt->zpad == 1) {
		orig[temp_len - 1] = orig[temp_len - 2];
	}

	N = temp_len;
	lp = wt->wave->lpd_len;

	if (!strcmp(wt->ext,"per")) {
		i = J;
		while (i > 0) {
			N = (int)ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += wt->length[i];
			i--;
		}
		wt->length[0] = wt->length[1];
		wt->outlength += wt->length[0];
		N = wt->outlength;

		for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
			N -= len_cA;
			if ( !strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT") ) {
				dwt1(wt, orig, temp_len, orig2, wt->params + N);
			}
			else {
				dwt_per(wt, orig, temp_len, orig2, len_cA, wt->params + N);
			}
			temp_len = wt->length[J - iter];
			if (iter == J - 1) {
				for (i = 0; i < len_cA; ++i) {
					wt->params[i] = orig2[i];
				}
			}
			else {
				for (i = 0; i < len_cA; ++i) {
					orig[i] = orig2[i];
				}
			}
		}
	}
	else if (!strcmp(wt->ext,"sym")) {
		//printf("\n YES %s \n", wt->ext);
		i = J;
		while (i > 0) {
			N = N + lp - 2;
			N = (int) ceil((double)N / 2.0);
			wt->length[i] = N;
			wt->outlength += wt->length[i];
			i--;
		}
		wt->length[0] = wt->length[1];
		wt->outlength += wt->length[0];
		N = wt->outlength;

		for (iter = 0; iter < J; ++iter) {
			len_cA = wt->length[J - iter];
			N -= len_cA;
			if (!strcmp(wt->cmethod, "fft") || !strcmp(wt->cmethod, "FFT")) {
				dwt1(wt, orig, temp_len, orig2, wt->params + N);
			}
			else {
				dwt_sym(wt, orig, temp_len, orig2, len_cA, wt->params + N);
			}
			temp_len = wt->length[J - iter];

			if (iter == J - 1) {
				for (i = 0; i < len_cA; ++i) {
					wt->params[i] = orig2[i];
				}
			}
			else {
				for (i = 0; i < len_cA; ++i) {
					orig[i] = orig2[i];
				}
			}
		}
	}
	else {
		printf("Signal extension can be either per or sym");
		exit(-1);
	}

	free(orig);
	free(orig2);
}